

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

parser_error parse_entry_name(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  embryonic_ui_entry *embryo;
  ui_entry *puVar4;
  wchar_t *pwVar5;
  long lVar6;
  
  pcVar3 = parser_getstr(p,"name");
  embryo = (embryonic_ui_entry *)parser_priv(p);
  if (embryo == (embryonic_ui_entry *)0x0) {
    embryo = (embryonic_ui_entry *)mem_alloc(0x20);
  }
  else {
    iVar1 = strcmp(pcVar3,embryo->entry->name);
    if (iVar1 == 0) {
      return PARSE_ERROR_NONE;
    }
    wVar2 = hatch_embryo(embryo);
    if (wVar2 != L'\0') {
      mem_free(embryo);
      parser_setpriv(p,(void *)0x0);
      return PARSE_ERROR_INVALID_VALUE;
    }
  }
  parser_setpriv(p,embryo);
  wVar2 = ui_entry_lookup(pcVar3);
  if (wVar2 < L'\x01') {
    puVar4 = (ui_entry *)mem_alloc(0x1d8);
    embryo->entry = puVar4;
    pcVar3 = string_make(pcVar3);
    puVar4 = embryo->entry;
    puVar4->name = pcVar3;
    pwVar5 = puVar4->shortened_buffer;
    puVar4->p_abilities = (bound_player_ability *)0x0;
    puVar4->label = (wchar_t *)0x0;
    puVar4->categories = (category_reference *)0x0;
    puVar4->obj_props = (bound_object_property *)0x0;
    puVar4->shortened_labels[0] = pwVar5;
    for (lVar6 = 6; lVar6 != 0xf; lVar6 = lVar6 + 1) {
      pwVar5 = pwVar5 + lVar6 + -4;
      puVar4->shortened_labels[lVar6 + -5] = pwVar5;
    }
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      puVar4->nshortened[lVar6] = L'\0';
    }
    puVar4 = embryo->entry;
    puVar4->nlabel = L'\0';
    puVar4->renderer_index = L'\0';
    puVar4->combiner_index = L'\0';
    puVar4->default_priority = L'\0';
    puVar4->flags = L'\0';
    puVar4->n_category = L'\0';
    puVar4->nalloc_category = L'\0';
    puVar4->n_obj_prop = L'\0';
    puVar4->n_obj_prop = L'\0';
    puVar4->nalloc_obj_prop = L'\0';
    puVar4->n_p_ability = L'\0';
    puVar4->nalloc_p_ability = L'\0';
    embryo->exists = false;
  }
  else {
    embryo->entry = entries[(ulong)(uint)wVar2 - 1];
    embryo->exists = true;
  }
  embryo->categories = (embryonic_category_reference *)0x0;
  embryo->param_index = L'\0';
  embryo->psource_index = L'\0';
  embryo->last_category_index = L'\xffffffff';
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_entry_name(struct parser *p)
{
	const char *name = parser_getstr(p, "name");
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int ind;

	if (embryo) {
		if (streq(name, embryo->entry->name)) {
			/*
			 * Strange case since the last record is the same as
			 * this one.  Simply proceeed to modify the previous
			 * record without a warning.
			 */
			return PARSE_ERROR_NONE;
		}
		if (hatch_embryo(embryo)) {
			mem_free(embryo);
			parser_setpriv(p, NULL);
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		embryo = mem_alloc(sizeof(*embryo));
	}

	parser_setpriv(p, embryo);
	ind = ui_entry_lookup(name);
	if (ind > 0) {
		/*
		 * Modify an already existing record.  Recall it, convert it
		 * back to embryonic form, and mark it as already existing.
		 */
		embryo->entry = entries[ind - 1];
		embryo->exists = true;
	} else {
		/* Make a completely new entry. */
		embryo->entry = mem_alloc(sizeof(*embryo->entry));
		embryo->entry->name = string_make(name);
		embryo->entry->categories = NULL;
		embryo->entry->obj_props = NULL;
		embryo->entry->p_abilities = NULL;
		embryo->entry->label = NULL;
		initialize_shortened(embryo->entry);
		embryo->entry->nlabel = 0;
		embryo->entry->renderer_index = 0;
		embryo->entry->combiner_index = 0;
		embryo->entry->default_priority = 0;
		embryo->entry->flags = 0;
		embryo->entry->n_category = 0;
		embryo->entry->nalloc_category = 0;
		embryo->entry->n_obj_prop = 0;
		embryo->entry->nalloc_obj_prop = 0;
		embryo->entry->n_p_ability = 0;
		embryo->entry->nalloc_p_ability = 0;
		embryo->exists = false;
	}
	embryo->categories = NULL;
	embryo->param_index = 0;
	embryo->psource_index = 0;
	embryo->last_category_index = -1;

	return PARSE_ERROR_NONE;
}